

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lowdiscrepancy.h
# Opt level: O0

Point2f __thiscall pbrt::HaltonPixelIndexer::SampleFirst2D(HaltonPixelIndexer *this)

{
  Tuple2<pbrt::Point2,_int> *in_RDI;
  Float FVar1;
  float in_stack_ffffffffffffffb8;
  float in_stack_ffffffffffffffbc;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 uVar2;
  undefined4 in_stack_ffffffffffffffe8;
  undefined4 in_stack_ffffffffffffffec;
  Tuple2<pbrt::Point2,_int> *pTVar3;
  int baseIndex;
  Tuple2<pbrt::Point2,_float> local_8;
  
  uVar2 = 0;
  pTVar3 = in_RDI;
  Tuple2<pbrt::Point2,_int>::operator[](in_RDI + 1,0);
  baseIndex = (int)((ulong)pTVar3 >> 0x20);
  FVar1 = RadicalInverse(baseIndex,CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8));
  Tuple2<pbrt::Point2,_int>::operator[](in_RDI,1);
  RadicalInverse(baseIndex,CONCAT44(FVar1,in_stack_ffffffffffffffe8));
  Point2<float>::Point2
            ((Point2<float> *)CONCAT44(uVar2,in_stack_ffffffffffffffc0),in_stack_ffffffffffffffbc,
             in_stack_ffffffffffffffb8);
  return (Point2f)local_8;
}

Assistant:

PBRT_CPU_GPU
    Point2f SampleFirst2D() const {
        return {RadicalInverse(0, sampleIndex >> baseExponents[0]),
                RadicalInverse(1, sampleIndex / baseScales[1])};
    }